

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  Node **ppNVar1;
  uint uVar2;
  TidyTagId TVar3;
  Lexer *pLVar4;
  Bool BVar5;
  Node *pNVar6;
  Dict *pDVar7;
  Node *pNVar8;
  Node *pNVar9;
  uint code;
  Node *pNVar10;
  Node **ppNVar11;
  char *property;
  long lVar12;
  bool bVar13;
  bool bVar14;
  
  if (list == (Node *)0x0) {
    bVar13 = false;
    pDVar7 = _DAT_00000038;
  }
  else {
    bVar13 = list->tag->id == TidyTag_OL;
    pDVar7 = list->tag;
  }
  if ((pDVar7->model & 1) != 0) {
    return;
  }
  pLVar4 = doc->lexer;
  pLVar4->insert = (IStack *)0x0;
  pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar6 != (Node *)0x0) {
    ppNVar1 = &list->content;
    do {
      if ((pNVar6->tag == list->tag) && (pNVar6->type == EndTag)) {
        prvTidyFreeNode(doc,pNVar6);
        list->closed = yes;
        return;
      }
      BVar5 = InsertMisc(list,pNVar6);
      if (BVar5 == no) {
        if (pNVar6->type == TextNode) {
          uVar2 = pNVar6->start;
          if (uVar2 < pNVar6->end) {
            lVar12 = 0;
            do {
              if ((0x20 < (ulong)(byte)pLVar4->lexbuf[lVar12 + (ulong)uVar2]) ||
                 ((0x100002600U >> ((ulong)(byte)pLVar4->lexbuf[lVar12 + (ulong)uVar2] & 0x3f) & 1)
                  == 0)) {
                pDVar7 = pNVar6->tag;
                goto LAB_0013eafa;
              }
              lVar12 = lVar12 + 1;
            } while (pNVar6->end - uVar2 != (int)lVar12);
          }
        }
        else {
          pDVar7 = pNVar6->tag;
          if (pDVar7 != (Dict *)0x0) {
LAB_0013eafa:
            if (pNVar6->type != EndTag) {
              pNVar9 = pNVar6;
              if (pDVar7 == (Dict *)0x0) {
                if (bVar13) goto LAB_0013ebd1;
                bVar14 = false;
LAB_0013ec27:
                BVar5 = prvTidyIsHTML5Mode(doc);
                if ((BVar5 != no) && (!bVar14)) goto LAB_0013ed62;
                prvTidyUngetToken(doc);
                BVar5 = prvTidynodeHasCM(pNVar6,8);
                if ((BVar5 != no) && (pLVar4->excludeBlocks != no)) {
                  code = 0x259;
                  goto LAB_0013eda4;
                }
                if (pLVar4->exiled != no) {
                  BVar5 = prvTidynodeHasCM(pNVar6,0x380);
                  if (BVar5 != no) {
                    return;
                  }
                  if ((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TidyTag_TABLE)) {
                    return;
                  }
                }
                if ((((list == (Node *)0x0) || (list->tag == (Dict *)0x0)) ||
                    (list->tag->id != TidyTag_OL)) || (pNVar8 = *ppNVar1, pNVar8 == (Node *)0x0)) {
LAB_0013ed0f:
                  BVar5 = prvTidynodeHasCM(pNVar6,8);
                  pNVar9 = prvTidyInferredTag(doc,TidyTag_LI);
                  property = "list-style: none; display: inline";
                  if (BVar5 == no) {
                    property = "list-style: none";
                  }
                  prvTidyAddStyleProperty(doc,pNVar9,property);
                  prvTidyReport(doc,list,pNVar9,0x261);
                  goto LAB_0013ed62;
                }
                pNVar9 = (Node *)0x0;
                pNVar10 = (Node *)0x0;
                do {
                  if (((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_LI)) &&
                     (pNVar8->type == StartTag)) {
                    pNVar10 = pNVar8;
                    pNVar9 = pNVar8;
                  }
                  pNVar8 = pNVar8->next;
                } while (pNVar8 != (Node *)0x0);
                if (pNVar10 == (Node *)0x0) goto LAB_0013ed0f;
                pNVar6 = prvTidyInferredTag(doc,TidyTag_LI);
                prvTidyReport(doc,list,pNVar6,0x261);
                prvTidyFreeNode(doc,pNVar6);
              }
              else {
                TVar3 = pDVar7->id;
                if ((bool)(TVar3 != TidyTag_LI & bVar13)) {
LAB_0013ebd1:
                  pNVar8 = *ppNVar1;
                  if (pNVar8 == (Node *)0x0) {
                    bVar14 = false;
                  }
                  else {
                    pNVar10 = (Node *)0x0;
                    do {
                      if (((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_LI)) &&
                         (pNVar8->type == StartTag)) {
                        pNVar10 = pNVar8;
                      }
                      pNVar8 = pNVar8->next;
                    } while (pNVar8 != (Node *)0x0);
                    bVar14 = pNVar10 != (Node *)0x0;
                  }
                  if (pDVar7 == (Dict *)0x0) goto LAB_0013ec27;
                  TVar3 = pDVar7->id;
                }
                else {
                  bVar14 = false;
                }
                if (TVar3 != TidyTag_LI) goto LAB_0013ec27;
LAB_0013ed62:
                pNVar9->parent = list;
                pNVar6 = list->last;
                pNVar9->prev = pNVar6;
                ppNVar11 = &pNVar6->next;
                if (pNVar6 == (Node *)0x0) {
                  ppNVar11 = ppNVar1;
                }
                *ppNVar11 = pNVar9;
                list->last = pNVar9;
              }
              ParseTag(doc,pNVar9,IgnoreWhitespace);
              goto LAB_0013eb88;
            }
            if ((pDVar7 == (Dict *)0x0) || (pDVar7->id != TidyTag_FORM)) {
              BVar5 = prvTidynodeHasCM(pNVar6,0x10);
              pNVar9 = list;
              if (BVar5 != no) {
                prvTidyReport(doc,list,pNVar6,0x235);
                prvTidyPopInline(doc,pNVar6);
                goto LAB_0013eb7d;
              }
              while ((pNVar9 = pNVar9->parent, pNVar9 != (Node *)0x0 &&
                     ((pDVar7 = pNVar9->tag, pDVar7 == (Dict *)0x0 || (pDVar7->id != TidyTag_BODY)))
                     )) {
                if (pNVar6->tag == pDVar7) {
                  prvTidyReport(doc,list,pNVar6,0x259);
                  prvTidyUngetToken(doc);
                  return;
                }
              }
            }
            else {
              *(byte *)&doc->badForm = (byte)doc->badForm | 1;
            }
          }
          prvTidyReport(doc,list,pNVar6,0x235);
        }
LAB_0013eb7d:
        prvTidyFreeNode(doc,pNVar6);
      }
LAB_0013eb88:
      pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (pNVar6 != (Node *)0x0);
  }
  pNVar6 = (Node *)0x0;
  code = 0x25a;
LAB_0013eda4:
  prvTidyReport(doc,list,pNVar6,code);
  return;
}

Assistant:

void TY_(ParseList)(TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode))
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_list = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node, *parent, *lastli;
    Bool wasblock;
    Bool nodeisOL = nodeIsOL(list);

#if defined(ENABLE_DEBUG_LOG)
    in_parse_list++;
    SPRTF("Entering ParseList %d...\n",in_parse_list);
#endif
    if (list->tag->model & CM_EMPTY)
    {
#if defined(ENABLE_DEBUG_LOG)
        in_parse_list--;
        SPRTF("Exit ParseList 1 %d... CM_EMPTY\n",in_parse_list);
#endif
        return;
    }
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        Bool foundLI = no;
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
#if defined(ENABLE_DEBUG_LOG)
            in_parse_list--;
            SPRTF("Exit ParseList 2 %d... Endtag\n",in_parse_list);
#endif
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        if (lexer && (node->type == TextNode))
        {
            uint ch, ix = node->start;
            /* Issue #572 - Skip whitespace. */
            while (ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && (ch == ' ' || ch == '\t' || ch == '\r' || ch == '\n'))
                ++ix;
            if (ix >= node->end)
            {
                /* Issue #572 - Discard if ALL whitespace. */
                TY_(FreeNode)(doc, node);
                continue;
            }
        }


        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_list--;
                    SPRTF("Exit ParseList 3 %d... No End Tag\n",in_parse_list);
#endif
                    return;
                }
            }

            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) && nodeisOL )
        {
            /* Issue #572 - A <ol><li> can have nested <ol> elements */
            foundLI = FindLastLI(list, &lastli); /* find last <li> */
        }

        if ( nodeIsLI(node) || (TY_(IsHTML5Mode)(doc) && !foundLI) )
        {
            /* node is <LI> OR
               Issue #396 - A <ul> can have Zero or more <li> elements
             */
            TY_(InsertNodeAtEnd)(list,node);
        }
        else
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
#if defined(ENABLE_DEBUG_LOG)
                in_parse_list--;
                SPRTF("Exit ParseList 4 %d... No End Tag\n",in_parse_list);
#endif
                return;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
            {
#if defined(ENABLE_DEBUG_LOG)
                in_parse_list--;
                SPRTF("Exit ParseList 5 %d... exiled\n",in_parse_list);
#endif
                return;
            }
            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within 
               the last <li> to preserve the numbering to match the visual 
               rendering of most browsers. */    
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with 
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none" 
                                       );
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }

        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
#if defined(ENABLE_DEBUG_LOG)
    in_parse_list--;
    SPRTF("Exit ParseList 6 %d... missing end tag\n",in_parse_list);
#endif
}